

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.h
# Opt level: O2

void __thiscall Init::RenameOptions::reflect(RenameOptions *this,StringWriter *writer)

{
  allocator<char> local_39;
  string local_38;
  
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartObject(writer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"prepareProvider",&local_39);
  reflectBool(writer,&local_38,this->prepareProvider,true);
  std::__cxx11::string::~string((string *)&local_38);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(writer,0);
  return;
}

Assistant:

void reflect (StringWriter &writer) override {
            writer.StartObject();
            reflectBool(writer, "prepareProvider", prepareProvider);
            writer.EndObject();
        }